

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

void ggml_opt_fit(ggml_backend_sched_t backend_sched,ggml_context *ctx_compute,ggml_tensor *inputs,
                 ggml_tensor *outputs,ggml_opt_dataset_t dataset,ggml_opt_loss_type loss_type,
                 ggml_opt_get_optimizer_params get_opt_pars,int64_t nepoch,int64_t nbatch_logical,
                 float val_split,bool silent)

{
  ggml_opt_params params_00;
  byte bVar1;
  int64_t iVar2;
  ggml_tensor *pgVar3;
  ggml_opt_dataset_t dataset_00;
  ggml_opt_result_t result_train_00;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_context *in_RSI;
  ggml_backend_sched_t in_RDI;
  ggml_opt_dataset_t in_R8;
  ggml_opt_loss_type in_R9D;
  float in_XMM0_Da;
  undefined8 unaff_retaddr;
  undefined8 in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  byte in_stack_00000020;
  undefined1 in_stack_00000021 [15];
  int64_t t_total_m;
  int64_t t_total_h;
  int64_t t_total_s;
  ggml_opt_epoch_callback epoch_callback;
  ggml_opt_result_t result_val;
  ggml_opt_result_t result_train;
  ggml_opt_context_t opt_ctx;
  ggml_opt_params params;
  int64_t epoch;
  int64_t idata_split;
  int64_t ibatch_split;
  int64_t nbatches_logical;
  int64_t opt_period;
  int64_t nbatch_physical;
  int64_t ndata;
  int64_t t_start_us;
  ggml_opt_epoch_callback in_stack_fffffffffffffed8;
  int64_t in_stack_fffffffffffffee0;
  ggml_opt_context_t pgVar7;
  ggml_opt_context_t in_stack_ffffffffffffff00;
  ggml_opt_context_t opt_ctx_00;
  ggml_opt_context_t pgStack_f8;
  ggml_opt_epoch_callback in_stack_ffffffffffffff10;
  int64_t iStack_d8;
  ggml_opt_dataset_t local_d0;
  ggml_opt_context_t pgStack_c8;
  undefined1 local_b8 [8];
  long local_78;
  
  bVar1 = in_stack_00000020 & 1;
  ggml_time_init();
  iVar2 = ggml_time_us();
  pgVar3 = ggml_opt_dataset_data(in_R8);
  lVar5 = pgVar3->ne[1];
  lVar6 = in_RDX->ne[1];
  if (lVar5 % in_stack_00000018 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-opt.cpp"
               ,0x31c,"GGML_ASSERT(%s) failed","ndata % nbatch_logical == 0");
  }
  if (in_stack_00000018 % lVar6 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-opt.cpp"
               ,0x31d,"GGML_ASSERT(%s) failed","nbatch_logical % nbatch_physical == 0");
  }
  if (in_XMM0_Da < 0.0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-opt.cpp"
               ,0x322,"GGML_ASSERT(%s) failed","val_split >= 0.0f");
  }
  if (in_XMM0_Da < 1.0) {
    local_78 = 1;
    ggml_opt_default_params((ggml_opt_params *)local_b8,in_RDI,in_RSI,in_RDX,in_RCX,in_R9D);
    memcpy(&stack0xffffffffffffff00,local_b8,0x40);
    params_00.ctx_compute = (ggml_context *)in_RDI;
    params_00.backend_sched = (ggml_backend_sched_t)in_RSI;
    params_00.outputs = (ggml_tensor *)in_stack_00000008;
    params_00.inputs = (ggml_tensor *)unaff_retaddr;
    params_00._32_8_ = in_stack_00000010;
    params_00._40_8_ = in_stack_00000018;
    params_00.get_opt_pars._0_1_ = in_stack_00000020;
    params_00._49_15_ = in_stack_00000021;
    opt_ctx_00 = in_stack_ffffffffffffff00;
    ggml_opt_init(params_00);
    if (in_stack_00000018 < lVar5) {
      ggml_opt_dataset_shuffle(pgStack_c8,local_d0,iStack_d8);
    }
    dataset_00 = (ggml_opt_dataset_t)ggml_opt_result_init();
    result_train_00 = ggml_opt_result_init();
    pgVar7 = (ggml_opt_context_t)ggml_opt_epoch_callback_progress_bar;
    if (bVar1 != 0) {
      pgVar7 = (ggml_opt_context_t)0x0;
    }
    for (; local_78 <= in_stack_00000010; local_78 = local_78 + 1) {
      in_stack_ffffffffffffff00 = pgVar7;
      if (in_stack_00000018 <
          (long)((1.0 - in_XMM0_Da) * (float)(lVar5 / in_stack_00000018)) *
          (in_stack_00000018 / lVar6) * lVar6) {
        ggml_opt_dataset_shuffle(pgStack_c8,local_d0,iStack_d8);
        in_stack_ffffffffffffff00 = pgVar7;
      }
      ggml_opt_result_reset((ggml_opt_result_t)0x167e50);
      ggml_opt_result_reset((ggml_opt_result_t)0x167e5a);
      if (bVar1 == 0) {
        fprintf(_stderr,"%s: epoch %04ld/%04ld:\n","ggml_opt_fit",local_78,in_stack_00000010);
      }
      pgVar7 = in_stack_ffffffffffffff00;
      ggml_opt_epoch(opt_ctx_00,dataset_00,result_train_00,
                     (ggml_opt_result_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffed8,in_stack_ffffffffffffff10);
      if (bVar1 == 0) {
        fprintf(_stderr,"\n");
      }
    }
    if (bVar1 == 0) {
      iVar4 = ggml_time_us();
      lVar5 = (iVar4 - iVar2) / 1000000;
      lVar6 = lVar5 % 0xe10;
      fprintf(_stderr,"%s: training took %02ld:%02ld:%02ld\n","ggml_opt_fit",lVar5 / 0xe10,
              lVar6 / 0x3c,lVar6 % 0x3c,in_stack_ffffffffffffff00);
    }
    ggml_opt_free(pgStack_f8);
    ggml_opt_result_free((ggml_opt_result_t)pgStack_f8);
    ggml_opt_result_free((ggml_opt_result_t)pgStack_f8);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-opt.cpp",
             0x323,"GGML_ASSERT(%s) failed","val_split < 1.0f");
}

Assistant:

void ggml_opt_fit(
        ggml_backend_sched_t            backend_sched,
        ggml_context                  * ctx_compute,
        ggml_tensor                   * inputs,
        ggml_tensor                   * outputs,
        ggml_opt_dataset_t              dataset,
        enum ggml_opt_loss_type         loss_type,
        ggml_opt_get_optimizer_params   get_opt_pars,
        int64_t                         nepoch,
        int64_t                         nbatch_logical,
        float                           val_split,
        bool                            silent) {
    ggml_time_init();
    const int64_t t_start_us = ggml_time_us();

    const int64_t ndata           = ggml_opt_dataset_data(dataset)->ne[1];
    const int64_t nbatch_physical = inputs->ne[1];
    GGML_ASSERT(ndata          % nbatch_logical  == 0);
    GGML_ASSERT(nbatch_logical % nbatch_physical == 0);

    const int64_t opt_period       = nbatch_logical / nbatch_physical;
    const int64_t nbatches_logical = ndata / nbatch_logical;

    GGML_ASSERT(val_split >= 0.0f);
    GGML_ASSERT(val_split <  1.0f);
    const int64_t ibatch_split = int64_t(((1.0f - val_split) * nbatches_logical)) * opt_period; // train <-> val split index (physical)
    const int64_t idata_split  = ibatch_split * nbatch_physical;

    int64_t epoch = 1;

    ggml_opt_params params = ggml_opt_default_params(backend_sched, ctx_compute, inputs, outputs, loss_type);
    params.opt_period      = opt_period;
    params.get_opt_pars    = get_opt_pars;
    params.get_opt_pars_ud = &epoch;
    ggml_opt_context_t opt_ctx = ggml_opt_init(params);

    // Shuffling the data is generally useful but there is only a point if not all data is used in a single batch.
    if (nbatch_logical < ndata) {
        ggml_opt_dataset_shuffle(opt_ctx, dataset, -1); // Shuffle all data (train + validation).
    }

    ggml_opt_result_t result_train = ggml_opt_result_init();
    ggml_opt_result_t result_val   = ggml_opt_result_init();

    ggml_opt_epoch_callback epoch_callback = silent ? nullptr : ggml_opt_epoch_callback_progress_bar;

    for (; epoch <= nepoch; ++epoch) {
        if (nbatch_logical < idata_split) {
            ggml_opt_dataset_shuffle(opt_ctx, dataset, idata_split);
        }

        ggml_opt_result_reset(result_train);
        ggml_opt_result_reset(result_val);

        if (!silent) {
            fprintf(stderr, "%s: epoch %04" PRId64 "/%04" PRId64 ":\n", __func__, epoch, nepoch);
        }
        ggml_opt_epoch(opt_ctx, dataset, result_train, result_val, idata_split, epoch_callback, epoch_callback);
        if (!silent) {
            fprintf(stderr, "\n");
        }
    }

    if (!silent) {
        int64_t t_total_s = (ggml_time_us() - t_start_us) / 1000000;
        const int64_t t_total_h = t_total_s / 3600;
        t_total_s -= t_total_h * 3600;
        const int64_t t_total_m = t_total_s / 60;
        t_total_s -= t_total_m * 60;
        fprintf(stderr, "%s: training took %02" PRId64 ":%02" PRId64 ":%02" PRId64 "\n", __func__, t_total_h, t_total_m, t_total_s);
    }

    ggml_opt_free(opt_ctx);
    ggml_opt_result_free(result_train);
    ggml_opt_result_free(result_val);
}